

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  int i;
  long lVar1;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar2;
  FileDescriptor *local_18;
  
  if ((file != (FileDescriptor *)0x0) &&
     (local_18 = file,
     pVar2 = std::
             _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
             ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                       ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                         *)&this->dependencies_,&local_18),
     (local_18 != (FileDescriptor *)0x0 & pVar2.second) == 1)) {
    lVar1 = 0;
    do {
      if (*(int *)(local_18 + 0x28) <= lVar1) {
        return;
      }
      RecordPublicDependencies
                (this,*(FileDescriptor **)
                       (*(long *)(local_18 + 0x20) +
                       (long)*(int *)(*(long *)(local_18 + 0x30) + lVar1 * 4) * 8));
      lVar1 = lVar1 + 1;
    } while (local_18 != (FileDescriptor *)0x0);
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == NULL || !dependencies_.insert(file).second) return;
  for (int i = 0; file != NULL && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}